

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O0

void __thiscall Fl_TooltipBox::draw(Fl_TooltipBox *this)

{
  int iVar1;
  int iVar2;
  Fl_Color FVar3;
  Fl_Font face;
  Fl_Fontsize fsize;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int H;
  int W;
  int Y;
  int X;
  Fl_TooltipBox *this_local;
  
  iVar1 = Fl_Widget::w((Fl_Widget *)this);
  iVar2 = Fl_Widget::h((Fl_Widget *)this);
  FVar3 = Fl_Tooltip::color();
  Fl_Widget::draw_box((Fl_Widget *)this,FL_BORDER_BOX,0,0,iVar1,iVar2,FVar3);
  FVar3 = Fl_Tooltip::textcolor();
  fl_color(FVar3);
  face = Fl_Tooltip::font();
  fsize = Fl_Tooltip::size();
  fl_font(face,fsize);
  iVar1 = Fl_Tooltip::margin_width();
  iVar2 = Fl_Tooltip::margin_height();
  iVar4 = Fl_Widget::w((Fl_Widget *)this);
  iVar5 = Fl_Tooltip::margin_width();
  iVar6 = Fl_Widget::h((Fl_Widget *)this);
  iVar7 = Fl_Tooltip::margin_height();
  fl_draw(tip,iVar1,iVar2,iVar4 + iVar5 * -2,iVar6 + iVar7 * -2,0x84,(Fl_Image *)0x0,1);
  return;
}

Assistant:

void Fl_TooltipBox::draw() {
  draw_box(FL_BORDER_BOX, 0, 0, w(), h(), Fl_Tooltip::color());
  fl_color(Fl_Tooltip::textcolor());
  fl_font(Fl_Tooltip::font(), Fl_Tooltip::size());
  int X = Fl_Tooltip::margin_width();
  int Y = Fl_Tooltip::margin_height();
  int W = w() - (Fl_Tooltip::margin_width()*2);
  int H = h() - (Fl_Tooltip::margin_height()*2);
  fl_draw(tip, X, Y, W, H, Fl_Align(FL_ALIGN_LEFT|FL_ALIGN_WRAP), 0, draw_symbols_);
}